

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O2

int Abc_CommandUndc(Abc_Frame_t *pAbc,int argc,char **argv)

{
  uint uVar1;
  Abc_Cex_t *p;
  bool bVar2;
  int iVar3;
  Abc_Ntk_t *pNtk;
  char *pcVar4;
  ulong uVar5;
  Abc_Cex_t *pAVar6;
  ulong uVar7;
  
  pNtk = Abc_FrameReadNtk(pAbc);
  bVar2 = false;
  Extra_UtilGetoptReset();
  while (iVar3 = Extra_UtilGetopt(argc,argv,"ch"), iVar3 == 99) {
    bVar2 = (bool)(bVar2 ^ 1);
  }
  if (iVar3 == -1) {
    if (pNtk == (Abc_Ntk_t *)0x0) {
      pcVar4 = "Empty network.\n";
    }
    else {
      if (!bVar2) {
        if (pNtk->nObjCounts[8] == 0) {
          pcVar4 = "The current network is combinational.\n";
          iVar3 = 0;
        }
        else {
          if (pNtk->ntkType == ABC_NTK_LOGIC) {
            Abc_NtkConvertDcLatches(pNtk);
            return 0;
          }
          pcVar4 = "This command works only for logic networks.\n";
          iVar3 = -1;
        }
        Abc_Print(iVar3,pcVar4);
        return 0;
      }
      if (pAbc->pCex != (Abc_Cex_t *)0x0) {
        pcVar4 = Abc_NtkCollectLatchValuesStr(pAbc->pNtkCur);
        uVar1 = pAbc->pNtkCur->nObjCounts[8];
        uVar7 = 0;
        uVar5 = (ulong)uVar1;
        if ((int)uVar1 < 1) {
          uVar5 = uVar7;
        }
        iVar3 = 0;
        for (; uVar5 != uVar7; uVar7 = uVar7 + 1) {
          iVar3 = iVar3 + (uint)(pcVar4[uVar7] == 'x');
        }
        uVar1 = pNtk->vPis->nSize;
        p = pAbc->pCex;
        if (iVar3 + uVar1 != p->nPis) {
          Abc_Print(-1,
                    "The number of PIs (%d) plus X-valued flops (%d) in the original network does not match the number of PIs in the current CEX (%d).\n"
                    ,(ulong)uVar1,(ulong)(uint)pNtk->nObjCounts[8]);
          return 1;
        }
        pAVar6 = Abc_CexTransformUndc(p,pcVar4);
        pAbc->pCex = pAVar6;
        if (pAVar6->nPis != pAbc->pNtkCur->vPis->nSize) {
          __assert_fail("pAbc->pCex->nPis == Abc_NtkPiNum(pAbc->pNtkCur)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                        ,0x4ecb,"int Abc_CommandUndc(Abc_Frame_t *, int, char **)");
        }
        if (pAVar6->nRegs == pAbc->pNtkCur->nObjCounts[8]) {
          Abc_CexFree(p);
          free(pcVar4);
          return 0;
        }
        __assert_fail("pAbc->pCex->nRegs == Abc_NtkLatchNum(pAbc->pNtkCur)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abc.c"
                      ,0x4ecc,"int Abc_CommandUndc(Abc_Frame_t *, int, char **)");
      }
      pcVar4 = "Current CEX is not available.\n";
    }
    iVar3 = -1;
  }
  else {
    iVar3 = -2;
    Abc_Print(-2,"usage: undc [-ch]\n");
    Abc_Print(-2,"\t        converts latches with DC init values into free PIs\n");
    pcVar4 = "yes";
    if (!bVar2) {
      pcVar4 = "no";
    }
    Abc_Print(-2,"\t-c    : toggles transforming CEX after \"logic;undc;st;zero\" [default = %s]\n",
              pcVar4);
    pcVar4 = "\t-h    : print the command usage\n";
  }
  Abc_Print(iVar3,pcVar4);
  return 1;
}

Assistant:

int Abc_CommandUndc( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c, fUseCex = 0;
    // set defaults
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ch" ) ) != EOF )
    {
        switch ( c )
        {
        case 'c':
            fUseCex ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }

    if ( fUseCex )
    {
        char * pInit;
        Abc_Cex_t * pTemp;
        int k, nFlopsX = 0;
        if ( pAbc->pCex == NULL )
        {
            Abc_Print( -1, "Current CEX is not available.\n" );
            return 1;
        }
        pInit = Abc_NtkCollectLatchValuesStr( pAbc->pNtkCur );
        // count the number of X-valued flops
        for ( k = 0; k < Abc_NtkLatchNum(pAbc->pNtkCur); k++ )
            nFlopsX += (int)(pInit[k] == 'x');
        // compare this value
        if ( Abc_NtkPiNum(pNtk) + nFlopsX != pAbc->pCex->nPis )
        {
            Abc_Print( -1, "The number of PIs (%d) plus X-valued flops (%d) in the original network does not match the number of PIs in the current CEX (%d).\n",
                Abc_NtkPiNum(pNtk), Abc_NtkLatchNum(pNtk), pAbc->pCex->nPis );
            return 1;
        }
        pAbc->pCex = Abc_CexTransformUndc( pTemp = pAbc->pCex, pInit );
        assert( pAbc->pCex->nPis == Abc_NtkPiNum(pAbc->pNtkCur) );
        assert( pAbc->pCex->nRegs == Abc_NtkLatchNum(pAbc->pNtkCur) );
        Abc_CexFree( pTemp );
        ABC_FREE( pInit );
        return 0;
    }

    if ( Abc_NtkIsComb(pNtk) )
    {
        Abc_Print( 0, "The current network is combinational.\n" );
        return 0;
    }

    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "This command works only for logic networks.\n" );
        return 0;
    }

    // get the new network
    Abc_NtkConvertDcLatches( pNtk );
    return 0;

usage:
    Abc_Print( -2, "usage: undc [-ch]\n" );
    Abc_Print( -2, "\t        converts latches with DC init values into free PIs\n" );
    Abc_Print( -2, "\t-c    : toggles transforming CEX after \"logic;undc;st;zero\" [default = %s]\n", fUseCex? "yes": "no" );
    Abc_Print( -2, "\t-h    : print the command usage\n");
    return 1;
}